

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::GetRML(Element *this,String *content)

{
  pointer ppVar1;
  NodePtr pDVar2;
  value_type *pvVar3;
  bool bVar4;
  PropertyMap *this_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *pair;
  pointer __lhs;
  String value;
  const_iterator __begin1;
  String local_50;
  
  ::std::__cxx11::string::append((char *)content);
  ::std::__cxx11::string::append((string *)content);
  ppVar1 = (this->attributes).m_container.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (this->attributes).m_container.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != ppVar1; __lhs = __lhs + 1) {
    bVar4 = ::std::operator==(&__lhs->first,"style");
    if (!bVar4) {
      value._M_string_length = 0;
      value.field_2._M_local_buf[0] = '\0';
      value._M_dataplus._M_p = (pointer)&value.field_2;
      bVar4 = Variant::
              GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&__lhs->second,&value);
      if (bVar4) {
        ::std::__cxx11::string::push_back((char)content);
        ::std::__cxx11::string::append((string *)content);
        ::std::__cxx11::string::append((char *)content);
        ::std::__cxx11::string::append((string *)content);
        ::std::__cxx11::string::append((char *)content);
      }
      ::std::__cxx11::string::~string((string *)&value);
    }
  }
  this_00 = ElementStyle::GetLocalStyleProperties(&this->meta->style);
  if (this_00->mNumElements != 0) {
    ::std::__cxx11::string::append((char *)content);
  }
  __begin1 = robin_hood::detail::
             Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
             ::cbegin(this_00);
  pDVar2 = (NodePtr)this_00->mInfo;
  while (__begin1.mKeyVals != pDVar2) {
    pvVar3 = &(__begin1.mKeyVals)->mData;
    StyleSheetSpecification::GetPropertyName_abi_cxx11_(((__begin1.mKeyVals)->mData).first);
    ::std::__cxx11::string::append((string *)content);
    ::std::__cxx11::string::append((char *)content);
    Property::ToString_abi_cxx11_(&local_50,&pvVar3->second);
    StringUtilities::EncodeRml(&value,&local_50);
    ::std::__cxx11::string::append((string *)content);
    ::std::__cxx11::string::~string((string *)&value);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::append((char *)content);
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++(&__begin1);
  }
  if (this_00->mNumElements != 0) {
    (content->_M_dataplus)._M_p[content->_M_string_length - 1] = '\"';
  }
  if (this->num_non_dom_children <
      (int)((ulong)((long)(this->children).
                          super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->children).
                         super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    ::std::__cxx11::string::append((char *)content);
    (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[8])(this,content);
    ::std::__cxx11::string::append((char *)content);
    ::std::__cxx11::string::append((string *)content);
  }
  ::std::__cxx11::string::append((char *)content);
  return;
}

Assistant:

void Element::GetRML(String& content)
{
	// First we start the open tag, add the attributes then close the open tag.
	// Then comes the children in order, then we add our close tag.
	content += "<";
	content += tag;

	for (auto& pair : attributes)
	{
		const String& name = pair.first;
		if (name == "style")
			continue;

		const Variant& variant = pair.second;
		String value;
		if (variant.GetInto(value))
		{
			content += ' ';
			content += name;
			content += "=\"";
			content += value;
			content += "\"";
		}
	}

	const PropertyMap& local_properties = meta->style.GetLocalStyleProperties();
	if (!local_properties.empty())
		content += " style=\"";

	for (const auto& pair : local_properties)
	{
		const PropertyId id = pair.first;
		const Property& property = pair.second;

		content += StyleSheetSpecification::GetPropertyName(id);
		content += ": ";
		content += StringUtilities::EncodeRml(property.ToString());
		content += "; ";
	}

	if (!local_properties.empty())
		content.back() = '\"';

	if (HasChildNodes())
	{
		content += ">";

		GetInnerRML(content);

		content += "</";
		content += tag;
		content += ">";
	}
	else
	{
		content += " />";
	}
}